

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoquad.cpp
# Opt level: O2

void pzgeom::TPZGeoQuad::VectorialProduct
               (TPZVec<double> *v1,TPZVec<double> *v2,TPZVec<double> *result)

{
  double dVar1;
  double dVar2;
  double *pdVar3;
  double *pdVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  ostream *poVar9;
  int64_t iVar10;
  
  if ((v1->fNElements == 3) && (v2->fNElements == 3)) {
    iVar10 = 3;
  }
  else {
    poVar9 = std::operator<<((ostream *)&std::cout," o tamanho do vetores eh diferente de 3");
    std::endl<char,std::char_traits<char>>(poVar9);
    iVar10 = v1->fNElements;
  }
  pdVar3 = v1->fStore;
  dVar1 = *pdVar3;
  pdVar4 = v2->fStore;
  dVar2 = *pdVar4;
  dVar5 = pdVar3[1];
  dVar6 = pdVar3[2];
  dVar7 = pdVar4[1];
  dVar8 = pdVar4[2];
  (*result->_vptr_TPZVec[3])(result,iVar10);
  pdVar3 = result->fStore;
  *pdVar3 = dVar8 * dVar5 - dVar6 * dVar7;
  pdVar3[1] = dVar2 * dVar6 - dVar1 * dVar8;
  pdVar3[2] = dVar1 * dVar7 - dVar2 * dVar5;
  return;
}

Assistant:

void TPZGeoQuad::VectorialProduct(TPZVec<REAL> &v1, TPZVec<REAL> &v2,TPZVec<REAL> &result){
		if(v1.NElements()!=3||v2.NElements()!=3)
		{
			cout << " o tamanho do vetores eh diferente de 3"<< endl;
		}
		REAL x1=v1[0], y1=v1[1],z1=v1[2];
		REAL x2=v2[0], y2=v2[1],z2=v2[2];
		result.Resize(v1.NElements());
		result[0]=y1*z2-z1*y2;
		result[1]=z1*x2-x1*z2;	
		result[2]=x1*y2-y1*x2;	
	}